

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void printHeader(FILE *socketFile,int command,FILE *requestedFile)

{
  char *__s;
  tm *__tp;
  ulong uVar1;
  time_t rtime;
  time_t tStack_28;
  
  if (command == 200) {
    fputs("HTTP/1.1 200 OK\r\n",(FILE *)socketFile);
    __s = (char *)malloc(100);
    time(&tStack_28);
    __tp = gmtime(&tStack_28);
    strftime(__s,8,"Date: %a, %d %b %y %H:%M:%S GMT\r\n",__tp);
    fputs(__s,(FILE *)socketFile);
    free(__s);
    fseek((FILE *)requestedFile,0,2);
    uVar1 = ftell((FILE *)requestedFile);
    rewind((FILE *)requestedFile);
    fprintf((FILE *)socketFile,"Content-Length: %d\r\n",uVar1 & 0xffffffff);
  }
  else if (command != 0x1f5) {
    if (command != 0x194) {
      printHeader_cold_1();
      return;
    }
    fputs("HTTP/1.1 404 Not found\r\n",(FILE *)socketFile);
  }
  fwrite("Connection: close\r\n",0x13,1,(FILE *)socketFile);
  fwrite("\r\n",2,1,(FILE *)socketFile);
  return;
}

Assistant:

static void printHeader(FILE* socketFile, int command,FILE *requestedFile) {
	switch(command){
		case 501:
			break;
			fputs("HTTP/1.1 501 Not implemented\r\n", socketFile);
		case 404:
			fputs("HTTP/1.1 404 Not found\r\n", socketFile);
			break;
		case 200:
			fputs("HTTP/1.1 200 OK\r\n", socketFile);
			sendDate(socketFile);
			sendContentLength(socketFile, requestedFile);
			break;
		default:
			ERROR_EXIT("invalid return value given");
			break;
	}
	fprintf(socketFile, "Connection: close\r\n");
	fprintf(socketFile, "\r\n");
}